

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O2

void __thiscall
TLeonardoHeap<smoothsort_ptr<double>_>::TLeonardoHeap
          (TLeonardoHeap<smoothsort_ptr<double>_> *this,smoothsort_ptr<double> *_data,size_t _N)

{
  size_t i;
  ulong element;
  
  this->data = _data;
  this->N = _N;
  this->tree_vector = 3;
  this->first_tree = 0;
  for (element = 2; element < _N; element = element + 1) {
    insertion_sort(this,element);
    _N = this->N;
  }
  return;
}

Assistant:

TLeonardoHeap<T>::TLeonardoHeap(T* _data, size_t _N) : data(_data) , N(_N) {
	// Initialize the heap with the first two elements
	tree_vector = 3;
	first_tree = 0;
	if(N > 1) { if(data[0] > data[1]) { swap(0, 1); } }
	// Insert each element sequentially
	for(size_t i=2; i<N; i++) { insertion_sort(i); }
}